

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2ModDel::renderAux2Main(V2ModDel *this,StereoSample *dest,int nsamples)

{
  float fVar1;
  float fVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (0 < nsamples && this->wetout != 0.0) {
    uVar8 = 0;
    do {
      fVar11 = this->inst->aux2buf[uVar8] + 3.8146973e-06;
      uVar3 = this->mcnt;
      uVar4 = this->mmaxoffs;
      uVar9 = (ulong)((int)uVar3 >> 0x1f ^ uVar3 * 2) * (ulong)uVar4;
      iVar10 = (int)(uVar9 >> 0x20) + this->dboffs[0];
      uVar5 = this->dbptr;
      pfVar7 = this->db[0];
      uVar6 = this->dbufmask;
      fVar12 = (pfVar7[(uVar5 - iVar10) - 1 & uVar6] - pfVar7[uVar5 - iVar10 & uVar6]) *
               ((float)((uint)(uVar9 >> 9) & 0x7fffff | 0x3f800000) + -1.0) +
               pfVar7[uVar5 - iVar10 & uVar6];
      pfVar7[uVar5] = this->fbval * fVar12 + fVar11;
      fVar1 = this->wetout;
      iVar10 = this->mphase + uVar3;
      uVar9 = (ulong)(uint)(iVar10 >> 0x1f ^ iVar10 * 2) * (ulong)uVar4;
      iVar10 = (int)(uVar9 >> 0x20) + this->dboffs[1];
      pfVar7 = this->db[1];
      fVar13 = (pfVar7[(uVar5 - iVar10) - 1 & uVar6] - pfVar7[uVar5 - iVar10 & uVar6]) *
               ((float)((uint)(uVar9 >> 9) & 0x7fffff | 0x3f800000) + -1.0) +
               pfVar7[uVar5 - iVar10 & uVar6];
      pfVar7[uVar5] = this->fbval * fVar13 + fVar11;
      fVar2 = this->wetout;
      this->mcnt = uVar3 + this->mfreq;
      this->dbptr = uVar5 + 1 & uVar6;
      dest[uVar8].field_0.l = fVar12 * fVar1 + fVar11 * 0.0 + dest[uVar8].field_0.l;
      *(float *)((long)dest + uVar8 * 8 + 4) =
           fVar13 * fVar2 + fVar11 * 0.0 + *(float *)((long)dest + uVar8 * 8 + 4);
      uVar8 = uVar8 + 1;
    } while ((uint)nsamples != uVar8);
  }
  return;
}

Assistant:

void renderAux2Main(StereoSample *dest, int nsamples)
    {
        if (!wetout)
            return;

        COVER("MODDEL aux->main");

        for (int i=0; i < nsamples; i++)
        {
            StereoSample x;

            float in = inst->aux2buf[i] + fcdcoffset;
            processSample(&x, in, in, 0.0f);

            dest[i].l += x.l;
            dest[i].r += x.r;
        }
    }